

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

ELEMENT_TYPE * getElementType(XML_Parser parser,ENCODING *enc,char *ptr,char *end)

{
  DTD *pDVar1;
  int iVar2;
  XML_Char *name;
  ELEMENT_TYPE *elementType;
  
  pDVar1 = parser->m_dtd;
  name = poolStoreString(&pDVar1->pool,enc,ptr,end);
  if ((name != (XML_Char *)0x0) &&
     (elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar1->elementTypes,name,0x28),
     elementType != (ELEMENT_TYPE *)0x0)) {
    if (elementType->name != name) {
      (pDVar1->pool).ptr = (pDVar1->pool).start;
      return elementType;
    }
    (pDVar1->pool).start = (pDVar1->pool).ptr;
    iVar2 = setElementTypePrefix(parser,elementType);
    if (iVar2 != 0) {
      return elementType;
    }
  }
  return (ELEMENT_TYPE *)0x0;
}

Assistant:

static ELEMENT_TYPE *
getElementType(XML_Parser parser, const ENCODING *enc, const char *ptr,
               const char *end) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  const XML_Char *name = poolStoreString(&dtd->pool, enc, ptr, end);
  ELEMENT_TYPE *ret;

  if (! name)
    return NULL;
  ret = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, name,
                               sizeof(ELEMENT_TYPE));
  if (! ret)
    return NULL;
  if (ret->name != name)
    poolDiscard(&dtd->pool);
  else {
    poolFinish(&dtd->pool);
    if (! setElementTypePrefix(parser, ret))
      return NULL;
  }
  return ret;
}